

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::sort_by<rangeless::fn::by::identity,rangeless::fn::impl::unstable_sort_tag>::
operator()(vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,
          sort_by<rangeless::fn::by::identity,rangeless::fn::impl::unstable_sort_tag> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *src)

{
  pointer pXVar1;
  
  operator()(src);
  pXVar1 = (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_finish = pXVar1;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (src->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Iterable operator()(Iterable src) const
        {
            impl::require_iterator_category_at_least<std::random_access_iterator_tag>(src);

            // this will fire if Iterable is std::map, where value_type is std::pair<const Key, Value>,
            // which is not move-assignable because of constness.
            static_assert(std::is_move_assignable<typename Iterable::value_type>::value, "value_type must be move-assignable.");

            s_sort( src, 
                    [this](const typename Iterable::value_type& x, 
                           const typename Iterable::value_type& y)
                    {
                        return lt{}(key_fn(x), key_fn(y));
                    }
                    , SortTag{});

            return src;
        }